

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O1

input_type __thiscall MODEL3D::three_dim_model::hash_prop(three_dim_model *this,string *inString)

{
  int iVar1;
  input_type iVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)inString);
  if (iVar1 == 0) {
    iVar2 = eNumber;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)inString);
    if (iVar1 == 0) {
      iVar2 = eName;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)inString);
      if (iVar1 == 0) {
        iVar2 = eMask_type;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)inString);
        if (iVar1 == 0) {
          iVar2 = eZ_Start;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)inString);
          if (iVar1 == 0) {
            iVar2 = eThickness;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)inString);
            if (iVar1 == 0) {
              iVar2 = eMaterial;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)inString);
              iVar2 = eDefault;
              if (iVar1 == 0) {
                iVar2 = eError;
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

MODEL3D::input_type MODEL3D::three_dim_model::hash_prop(std::string const& inString)
{
    if(inString == "Number") return eNumber;
    if(inString == "Name") return eName;
    if(inString == "MaskType") return eMask_type;
    if(inString == "ZStart") return eZ_Start;
    if(inString == "Thickness") return eThickness;
    if(inString == "Material") return eMaterial;
    if(inString == "$End") return eError;
    return eDefault;
}